

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O0

error_code mio::detail::last_error(void)

{
  int __v;
  int *piVar1;
  error_category *__cat;
  error_code eVar2;
  undefined1 local_18 [8];
  error_code error;
  
  std::error_code::error_code((error_code *)local_18);
  piVar1 = __errno_location();
  __v = *piVar1;
  __cat = (error_category *)std::_V2::system_category();
  std::error_code::assign((error_code *)local_18,__v,__cat);
  eVar2._4_4_ = 0;
  eVar2._M_value = local_18._0_4_;
  eVar2._M_cat = (error_category *)error._0_8_;
  return eVar2;
}

Assistant:

inline std::error_code last_error() noexcept
{
    std::error_code error;
#ifdef _WIN32
    error.assign(GetLastError(), std::system_category());
#else
    error.assign(errno, std::system_category());
#endif
    return error;
}